

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O3

bool __thiscall BlockDevice::Open(BlockDevice *this,string *path,bool uncached)

{
  int *piVar1;
  int64_t *piVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  long lVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  hd_driveid *path_00;
  int __oflag;
  
  __oflag = (int)CONCAT71(in_register_00000011,uncached) * 0x4000;
  iVar4 = open64((path->_M_dataplus)._M_p,__oflag + 2);
  (this->super_HDD).h = iVar4;
  if (iVar4 == -1) {
    iVar4 = open64((path->_M_dataplus)._M_p,__oflag);
    (this->super_HDD).h = iVar4;
    if (iVar4 == -1) {
      return false;
    }
  }
  piVar1 = &(this->super_HDD).sector_size;
  iVar4 = ioctl(iVar4,0x1268,piVar1);
  if (iVar4 < 0) {
    *piVar1 = 0x200;
  }
  piVar2 = &(this->super_HDD).total_bytes;
  iVar4 = ioctl((this->super_HDD).h,0x80081272,piVar2);
  if (iVar4 == 0) {
    uVar7 = *piVar2 / (long)*piVar1;
  }
  else {
    bVar3 = IsFile(path);
    if (bVar3) {
      return false;
    }
    (this->super_HDD).sector_size = 0x200;
    iVar5 = FileSize(path);
    lVar6 = iVar5 - (this->super_HDD).data_offset;
    (this->super_HDD).total_bytes = lVar6;
    uVar7 = lVar6 / (long)(this->super_HDD).sector_size & 0xffffffff;
  }
  (this->super_HDD).total_sectors = uVar7;
  if (uVar7 == 0) {
    return false;
  }
  path_00 = (hd_driveid *)0x30d;
  iVar4 = ioctl((this->super_HDD).h,0x30d,&ReadIdentifyData::hd);
  if (iVar4 == 0) {
    (this->super_HDD).sIdentify.len = 0x200;
    path_00 = &ReadIdentifyData::hd;
    memcpy(&(this->super_HDD).sIdentify.field_1,&ReadIdentifyData::hd,0x200);
  }
  if ((this->super_HDD).sectors == 0) {
    path_00 = (hd_driveid *)&(this->super_HDD).cyls;
    CalculateGeometry((this->super_HDD).total_sectors,(int *)path_00,&(this->super_HDD).heads,
                      &(this->super_HDD).sectors);
  }
  ReadMakeModelRevisionSerial(this,(string *)path_00);
  return true;
}

Assistant:

bool BlockDevice::Open(const std::string& path, bool uncached)
{
    auto flags = O_BINARY | (uncached ? O_DIRECT : 0);
    // Open as read-write, falling back on read-only
    if ((h = open(path.c_str(), O_RDWR | flags)) == -1 &&
        (h = open(path.c_str(), O_RDONLY | flags)) == -1)
    {
        // Win32 has a second attempt at opening, via SAMdiskHelper
#ifdef _WIN32
#define PIPENAME    R"(\\.\pipe\SAMdiskHelper)"
#define FN_OPEN     2

#pragma pack(push,1)
        struct PIPEMESSAGE
        {
            union
            {
                struct
                {
                    DWORD dwMessage;
                    char szPath[MAX_PATH];
                } Input;

                struct
                {
                    DWORD dwError;
                    DWORD64 hDevice;
                } Output;
            };
        };
#pragma pack(pop)

        DWORD dwRead;
        PIPEMESSAGE msg = {};
        msg.Input.dwMessage = FN_OPEN;
        strncpy(msg.Input.szPath, path.c_str(), MAX_PATH - 1);

        if (CallNamedPipe(PIPENAME, &msg, sizeof(msg.Input), &msg, sizeof(msg.Output), &dwRead, NMPWAIT_NOWAIT))
        {
            if (dwRead == sizeof(msg.Output) && msg.Output.dwError == 0)
            {
                // Wrap the Win32 handler in a CRT file handle
                h = _open_osfhandle((intptr_t)msg.Output.hDevice, 0);
            }
            else if (msg.Output.dwError != 0)
            {
                SetLastError(msg.Output.dwError);
            }
        }

        if (h == -1)
#endif
        {
            return false;
        }
    }

#ifdef _WIN32
    DWORD dwRet;

    // Retrieve the Win32 file handle for IOCTL calls
    hdev = reinterpret_cast<HANDLE>(_get_osfhandle(h));

    // Determine sector size
    DISK_GEOMETRY dg;
    if (DeviceIoControl(hdev, IOCTL_DISK_GET_DRIVE_GEOMETRY, nullptr, 0, &dg, sizeof(dg), &dwRet, nullptr) && dg.BytesPerSector)
        sector_size = dg.BytesPerSector;
    else
        sector_size = SECTOR_SIZE;

    // Determine byte size, and from that calculate sector count
    PARTITION_INFORMATION pi;
    if (DeviceIoControl(hdev, IOCTL_DISK_GET_PARTITION_INFO, nullptr, 0, &pi, sizeof(pi), &dwRet, nullptr))
    {
        total_bytes = pi.PartitionLength.QuadPart;

        // HACK: round to an even number of sectors, to fix broken CF cards/readers
        total_bytes &= ~0x3ff;

        total_sectors = total_bytes / sector_size;

#if 0
        // ToDo: still needed?
        // Rather than clip to 32-bits, use the maximum value
        if (total_bytes > total_sectors* sector_size)
            total_sectors = (1LL << 32) - 1;
#endif
    }
#elif defined(BLKSSZGET) && defined(BLKGETSIZE64)

    if (ioctl(h, BLKSSZGET, &sector_size) < 0)
        sector_size = SECTOR_SIZE;

    if (ioctl(h, BLKGETSIZE64, &total_bytes) == 0)
        total_sectors = total_bytes / sector_size;

#elif defined(HAVE_DISKARBITRATION_DISKARBITRATION_H)
    DASessionRef session = DASessionCreate(kCFAllocatorDefault);
    DADiskRef disk = DADiskCreateFromBSDName(kCFAllocatorDefault, session, path.c_str());
    if (disk)
    {
        CFDictionaryRef diskInfo = DADiskCopyDescription(disk);
        if (diskInfo)
        {
            long long llSize = 0;
            int nBlockSize = SECTOR_SIZE;

            auto numMediaSize = static_cast<CFNumberRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionMediaSizeKey));
            auto numBlockSize = static_cast<CFNumberRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionMediaBlockSizeKey));

            CFNumberGetValue(numMediaSize, kCFNumberLongLongType, &llSize);
            CFNumberGetValue(numBlockSize, kCFNumberIntType, &nBlockSize);

            sector_size = nBlockSize;
            total_bytes = llSize;
            total_sectors = total_bytes / sector_size;

            CFRelease(diskInfo);
        }

        CFRelease(disk);
        CFRelease(session);
    }
#endif // WIN32
    else
    {
        if (IsFile(path))
        {
#ifdef _WIN32
            SetLastError(ERROR_ACCESS_DENIED);
#endif
            return false;
        }